

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
CustomLayerParams_CustomLayerParamValue
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  bool bVar1;
  uint32_t uVar2;
  int32_t iVar3;
  ulong uVar4;
  ValueUnion VVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CustomLayerParams_CustomLayerParamValue_004b6bc0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar4 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar4 & 0xfffffffffffffffc) + 8));
  }
  this->_oneof_case_[0] = 0;
  uVar2 = from->_oneof_case_[0];
  if ((int)uVar2 < 0x1e) {
    if (uVar2 == 10) {
      VVar5 = from->value_;
      clear_value(this);
      this->_oneof_case_[0] = 10;
      this->value_ = VVar5;
    }
    else if (uVar2 == 0x14) {
      if (uVar2 == 0x14) {
        puVar7 = (undefined8 *)((from->value_).longvalue_ & 0xfffffffffffffffe);
      }
      else {
        puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      }
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
      (this->value_).doublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar6 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        puVar6 = (undefined8 *)*puVar6;
      }
      google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->value_,puVar7,puVar6)
      ;
    }
  }
  else if (uVar2 == 0x1e) {
    iVar3 = (from->value_).intvalue_;
    clear_value(this);
    this->_oneof_case_[0] = 0x1e;
    (this->value_).intvalue_ = iVar3;
  }
  else if (uVar2 == 0x28) {
    VVar5 = from->value_;
    clear_value(this);
    this->_oneof_case_[0] = 0x28;
    this->value_ = VVar5;
  }
  else if (uVar2 == 0x32) {
    bVar1 = (from->value_).boolvalue_;
    clear_value(this);
    this->_oneof_case_[0] = 0x32;
    (this->value_).boolvalue_ = bVar1;
  }
  return;
}

Assistant:

CustomLayerParams_CustomLayerParamValue::CustomLayerParams_CustomLayerParamValue(const CustomLayerParams_CustomLayerParamValue& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
}